

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this)

{
  ~IfcProcess((IfcProcess *)&this[-1].super_IfcObject.field_0x28);
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}